

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O0

int __thiscall deqp::egl::SharingTests::init(SharingTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestCaseGroup *this_00;
  TestCaseGroup *pTVar1;
  GLES2SharingTest *pGVar2;
  GLES2BufferSharingTest *pGVar3;
  GLES2TextureSharingTest *pGVar4;
  GLES2ProgramSharingTest *pGVar5;
  GLES2ShaderSharingTest *pGVar6;
  TestNode *node;
  undefined1 local_128 [8];
  TestSpec spec_16;
  TestSpec spec_15;
  TestSpec spec_14;
  TestSpec spec_13;
  TestSpec spec_12;
  TestSpec spec_11;
  TestCaseGroup *shader;
  undefined1 local_d0;
  undefined1 local_cf;
  undefined1 local_ce;
  undefined1 local_cd;
  TestSpec spec_10;
  TestSpec spec_9;
  TestSpec spec_8;
  TestCaseGroup *program;
  undefined1 local_a0;
  undefined1 local_9f;
  undefined1 local_9e;
  undefined1 local_9d;
  TestSpec spec_7;
  TestSpec spec_6;
  TestSpec spec_5;
  TestCaseGroup *texture;
  undefined1 local_70;
  undefined1 local_6f;
  undefined1 local_6e;
  undefined1 local_6d;
  TestSpec spec_4;
  TestSpec spec_3;
  TestSpec spec_2;
  TestCaseGroup *buffer;
  TestSpec spec_1;
  TestSpec spec;
  TestCaseGroup *context;
  TestCaseGroup *gles2;
  SharingTests *this_local;
  
  this_00 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_00,(this->super_TestCaseGroup).m_eglTestCtx,"gles2","OpenGL ES 2 sharing test");
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"context",
             "Context creation and destruction tests");
  spec_1.renderOnContexA = false;
  spec_1.renderOnContexB = false;
  spec_1.verifyOnContexA = false;
  spec_1.verifyOnContexB = true;
  pGVar2 = (GLES2SharingTest *)operator_new(0x1ac8);
  GLES2SharingTest::GLES2SharingTest
            (pGVar2,(this->super_TestCaseGroup).m_eglTestCtx,"create_destroy",
             "Simple context creation and destruction",(TestSpec *)&spec_1.destroyContextBFirst);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar2);
  buffer._4_1_ = 1;
  buffer._5_1_ = 0;
  buffer._6_1_ = 0;
  buffer._7_1_ = 0;
  spec_1.type._0_1_ = BUFFER;
  spec_1.type._1_1_ = BUFFER >> 8;
  spec_1.type._2_1_ = BUFFER >> 0x10;
  spec_1.type._3_1_ = BUFFER >> 0x18;
  pGVar2 = (GLES2SharingTest *)operator_new(0x1ac8);
  GLES2SharingTest::GLES2SharingTest
            (pGVar2,(this->super_TestCaseGroup).m_eglTestCtx,"create_destroy_mixed",
             "Simple context creation and destruction test with different destruction order",
             (TestSpec *)&buffer);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar2);
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pTVar1);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"buffer",
             "Buffer creation, destruction and rendering test");
  spec_3.renderOnContexA = false;
  spec_3.renderOnContexB = true;
  spec_3.verifyOnContexA = false;
  spec_3.verifyOnContexB = true;
  pGVar3 = (GLES2BufferSharingTest *)operator_new(0x1ae8);
  GLES2BufferSharingTest::GLES2BufferSharingTest
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete",
             "Create and delete on shared context",(TestSpec *)&spec_3.destroyContextBFirst);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar3);
  spec_4.renderOnContexA = false;
  spec_4.renderOnContexB = true;
  spec_4.verifyOnContexA = true;
  spec_4.verifyOnContexB = true;
  spec_3.type._0_1_ = BUFFER;
  spec_3.type._1_1_ = BUFFER >> 8;
  spec_3.type._2_1_ = BUFFER >> 0x10;
  spec_3.type._3_1_ = BUFFER >> 0x18;
  pGVar3 = (GLES2BufferSharingTest *)operator_new(0x1ae8);
  GLES2BufferSharingTest::GLES2BufferSharingTest
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete_mixed",
             "Create and delet on different contexts",(TestSpec *)&spec_4.destroyContextBFirst);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar3);
  local_70 = 0;
  local_6f = 1;
  local_6e = 0;
  local_6d = 1;
  spec_4.type._0_1_ = TEXTURE;
  spec_4.type._1_1_ = 1;
  spec_4.type._2_1_ = 1;
  spec_4.type._3_1_ = 1;
  pGVar3 = (GLES2BufferSharingTest *)operator_new(0x1ae8);
  GLES2BufferSharingTest::GLES2BufferSharingTest
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"render",
             "Create, rendering on two different contexts and delete",
             (TestSpec *)((long)&texture + 4));
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar3);
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pTVar1);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"texture",
             "Texture creation, destruction and rendering tests");
  spec_6.renderOnContexA = false;
  spec_6.renderOnContexB = true;
  spec_6.verifyOnContexA = false;
  spec_6.verifyOnContexB = true;
  pGVar4 = (GLES2TextureSharingTest *)operator_new(0x1b20);
  GLES2TextureSharingTest::GLES2TextureSharingTest
            (pGVar4,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete",
             "Create and delete on shared context",(TestSpec *)&spec_6.destroyContextBFirst);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar4);
  spec_7.renderOnContexA = false;
  spec_7.renderOnContexB = true;
  spec_7.verifyOnContexA = true;
  spec_7.verifyOnContexB = true;
  spec_6.type._0_1_ = BUFFER;
  spec_6.type._1_1_ = BUFFER >> 8;
  spec_6.type._2_1_ = BUFFER >> 0x10;
  spec_6.type._3_1_ = BUFFER >> 0x18;
  pGVar4 = (GLES2TextureSharingTest *)operator_new(0x1b20);
  GLES2TextureSharingTest::GLES2TextureSharingTest
            (pGVar4,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete_mixed",
             "Create and delete on different contexts",(TestSpec *)&spec_7.destroyContextBFirst);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar4);
  local_a0 = 0;
  local_9f = 1;
  local_9e = 0;
  local_9d = 1;
  spec_7.type._0_1_ = TEXTURE;
  spec_7.type._1_1_ = 1;
  spec_7.type._2_1_ = 1;
  spec_7.type._3_1_ = 1;
  pGVar4 = (GLES2TextureSharingTest *)operator_new(0x1b20);
  GLES2TextureSharingTest::GLES2TextureSharingTest
            (pGVar4,(this->super_TestCaseGroup).m_eglTestCtx,"render",
             "Create, render in two contexts and delete",(TestSpec *)((long)&program + 4));
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar4);
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pTVar1);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"program",
             "Program creation, destruction and rendering test");
  spec_9.renderOnContexA = false;
  spec_9.renderOnContexB = true;
  spec_9.verifyOnContexA = false;
  spec_9.verifyOnContexB = true;
  pGVar5 = (GLES2ProgramSharingTest *)operator_new(0x1ad0);
  GLES2ProgramSharingTest::GLES2ProgramSharingTest
            (pGVar5,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete",
             "Create and delete on shared context",(TestSpec *)&spec_9.destroyContextBFirst);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar5);
  spec_10.renderOnContexA = false;
  spec_10.renderOnContexB = true;
  spec_10.verifyOnContexA = true;
  spec_10.verifyOnContexB = true;
  spec_9.type._0_1_ = BUFFER;
  spec_9.type._1_1_ = BUFFER >> 8;
  spec_9.type._2_1_ = BUFFER >> 0x10;
  spec_9.type._3_1_ = BUFFER >> 0x18;
  pGVar5 = (GLES2ProgramSharingTest *)operator_new(0x1ad0);
  GLES2ProgramSharingTest::GLES2ProgramSharingTest
            (pGVar5,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete_mixed",
             "Create and delete on different contexts",(TestSpec *)&spec_10.destroyContextBFirst);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar5);
  local_d0 = 0;
  local_cf = 1;
  local_ce = 0;
  local_cd = 1;
  spec_10.type._0_1_ = TEXTURE;
  spec_10.type._1_1_ = 1;
  spec_10.type._2_1_ = 1;
  spec_10.type._3_1_ = 1;
  pGVar5 = (GLES2ProgramSharingTest *)operator_new(0x1ad0);
  GLES2ProgramSharingTest::GLES2ProgramSharingTest
            (pGVar5,(this->super_TestCaseGroup).m_eglTestCtx,"render",
             "Create, render in two contexts and delete",(TestSpec *)((long)&shader + 4));
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar5);
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pTVar1);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"shader",
             "Shader creation, destruction and rendering test");
  spec_12.renderOnContexA = false;
  spec_12.renderOnContexB = true;
  spec_12.verifyOnContexA = false;
  spec_12.verifyOnContexB = true;
  pGVar6 = (GLES2ShaderSharingTest *)operator_new(0x1ad0);
  GLES2ShaderSharingTest::GLES2ShaderSharingTest
            (pGVar6,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete_vert",
             "Create and delete on shared context",0x8b31,(TestSpec *)&spec_12.destroyContextBFirst)
  ;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar6);
  spec_13.renderOnContexA = false;
  spec_13.renderOnContexB = true;
  spec_13.verifyOnContexA = true;
  spec_13.verifyOnContexB = true;
  spec_12.type._0_1_ = BUFFER;
  spec_12.type._1_1_ = BUFFER >> 8;
  spec_12.type._2_1_ = BUFFER >> 0x10;
  spec_12.type._3_1_ = BUFFER >> 0x18;
  pGVar6 = (GLES2ShaderSharingTest *)operator_new(0x1ad0);
  GLES2ShaderSharingTest::GLES2ShaderSharingTest
            (pGVar6,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete_mixed_vert",
             "Create and delete on different contexts",0x8b31,
             (TestSpec *)&spec_13.destroyContextBFirst);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar6);
  spec_14.renderOnContexA = false;
  spec_14.renderOnContexB = true;
  spec_14.verifyOnContexA = false;
  spec_14.verifyOnContexB = true;
  spec_13.type._0_1_ = TEXTURE;
  spec_13.type._1_1_ = 1;
  spec_13.type._2_1_ = 1;
  spec_13.type._3_1_ = 1;
  pGVar6 = (GLES2ShaderSharingTest *)operator_new(0x1ad0);
  GLES2ShaderSharingTest::GLES2ShaderSharingTest
            (pGVar6,(this->super_TestCaseGroup).m_eglTestCtx,"render_vert",
             "Create, render on two contexts and delete",0x8b31,
             (TestSpec *)&spec_14.destroyContextBFirst);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar6);
  spec_15.renderOnContexA = false;
  spec_15.renderOnContexB = true;
  spec_15.verifyOnContexA = false;
  spec_15.verifyOnContexB = true;
  spec_14.type._0_1_ = BUFFER;
  spec_14.type._1_1_ = BUFFER >> 8;
  spec_14.type._2_1_ = BUFFER >> 0x10;
  spec_14.type._3_1_ = BUFFER >> 0x18;
  pGVar6 = (GLES2ShaderSharingTest *)operator_new(0x1ad0);
  GLES2ShaderSharingTest::GLES2ShaderSharingTest
            (pGVar6,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete_frag",
             "Create and delete on shared context",0x8b30,(TestSpec *)&spec_15.destroyContextBFirst)
  ;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar6);
  spec_16.renderOnContexA = false;
  spec_16.renderOnContexB = true;
  spec_16.verifyOnContexA = true;
  spec_16.verifyOnContexB = true;
  spec_15.type._0_1_ = BUFFER;
  spec_15.type._1_1_ = BUFFER >> 8;
  spec_15.type._2_1_ = BUFFER >> 0x10;
  spec_15.type._3_1_ = BUFFER >> 0x18;
  pGVar6 = (GLES2ShaderSharingTest *)operator_new(0x1ad0);
  GLES2ShaderSharingTest::GLES2ShaderSharingTest
            (pGVar6,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete_mixed_frag",
             "Create and delete on different contexts",0x8b30,
             (TestSpec *)&spec_16.destroyContextBFirst);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar6);
  local_128[4] = false;
  local_128[5] = true;
  local_128[6] = false;
  local_128[7] = true;
  spec_16.type._0_1_ = TEXTURE;
  spec_16.type._1_1_ = 1;
  spec_16.type._2_1_ = 1;
  spec_16.type._3_1_ = 1;
  pGVar6 = (GLES2ShaderSharingTest *)operator_new(0x1ad0);
  GLES2ShaderSharingTest::GLES2ShaderSharingTest
            (pGVar6,(this->super_TestCaseGroup).m_eglTestCtx,"render_frag",
             "Create, render on two contexts and delete",0x8b30,(TestSpec *)local_128);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pGVar6);
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pTVar1);
  node = (TestNode *)operator_new(0x78);
  GLES2SharingThreadedTests::GLES2SharingThreadedTests
            ((GLES2SharingThreadedTests *)node,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this_00,node);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  return extraout_EAX;
}

Assistant:

void SharingTests::init (void)
{
	TestCaseGroup* gles2 = new TestCaseGroup(m_eglTestCtx, "gles2", "OpenGL ES 2 sharing test");

	TestCaseGroup* context = new TestCaseGroup(m_eglTestCtx, "context", "Context creation and destruction tests");

	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= false;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= true;
		spec.renderOnContexB		= true;
		spec.verifyOnContexA		= true;
		spec.verifyOnContexB		= true;

		context->addChild(new GLES2SharingTest(m_eglTestCtx, "create_destroy", "Simple context creation and destruction", spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= true;
		spec.useResource			= false;
		spec.destroyOnContexB		= false;
		spec.initializeData			= false;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		context->addChild(new GLES2SharingTest(m_eglTestCtx, "create_destroy_mixed", "Simple context creation and destruction test with different destruction order", spec));
	}

	gles2->addChild(context);

	TestCaseGroup* buffer = new TestCaseGroup(m_eglTestCtx, "buffer", "Buffer creation, destruction and rendering test");

	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		buffer->addChild(new GLES2BufferSharingTest(m_eglTestCtx, "create_delete", "Create and delete on shared context", spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= true;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		buffer->addChild(new GLES2BufferSharingTest(m_eglTestCtx, "create_delete_mixed", "Create and delet on different contexts", spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= true;
		spec.renderOnContexB		= true;
		spec.verifyOnContexA		= true;
		spec.verifyOnContexB		= true;

		buffer->addChild(new GLES2BufferSharingTest(m_eglTestCtx, "render", "Create, rendering on two different contexts and delete", spec));
	}

	gles2->addChild(buffer);

	TestCaseGroup* texture = new TestCaseGroup(m_eglTestCtx, "texture", "Texture creation, destruction and rendering tests");

	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		texture->addChild(new GLES2TextureSharingTest(m_eglTestCtx, "create_delete", "Create and delete on shared context", spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= true;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		texture->addChild(new GLES2TextureSharingTest(m_eglTestCtx, "create_delete_mixed", "Create and delete on different contexts", spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= true;
		spec.renderOnContexB		= true;
		spec.verifyOnContexA		= true;
		spec.verifyOnContexB		= true;

		texture->addChild(new GLES2TextureSharingTest(m_eglTestCtx, "render", "Create, render in two contexts and delete", spec));
	}

	gles2->addChild(texture);

	TestCaseGroup* program = new TestCaseGroup(m_eglTestCtx, "program", "Program creation, destruction and rendering test");

	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		program->addChild(new GLES2ProgramSharingTest(m_eglTestCtx, "create_delete", "Create and delete on shared context", spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= true;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		program->addChild(new GLES2ProgramSharingTest(m_eglTestCtx, "create_delete_mixed", "Create and delete on different contexts", spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= true;
		spec.renderOnContexB		= true;
		spec.verifyOnContexA		= true;
		spec.verifyOnContexB		= true;

		program->addChild(new GLES2ProgramSharingTest(m_eglTestCtx, "render", "Create, render in two contexts and delete", spec));
	}

	gles2->addChild(program);

	TestCaseGroup* shader = new TestCaseGroup(m_eglTestCtx, "shader", "Shader creation, destruction and rendering test");

	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		shader->addChild(new GLES2ShaderSharingTest(m_eglTestCtx, "create_delete_vert", "Create and delete on shared context", GL_VERTEX_SHADER, spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= true;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		shader->addChild(new GLES2ShaderSharingTest(m_eglTestCtx, "create_delete_mixed_vert", "Create and delete on different contexts", GL_VERTEX_SHADER, spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= true;
		spec.renderOnContexB		= true;
		spec.verifyOnContexA		= true;
		spec.verifyOnContexB		= true;

		shader->addChild(new GLES2ShaderSharingTest(m_eglTestCtx, "render_vert", "Create, render on two contexts and delete", GL_VERTEX_SHADER, spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		shader->addChild(new GLES2ShaderSharingTest(m_eglTestCtx, "create_delete_frag", "Create and delete on shared context", GL_FRAGMENT_SHADER, spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= true;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		shader->addChild(new GLES2ShaderSharingTest(m_eglTestCtx, "create_delete_mixed_frag", "Create and delete on different contexts", GL_FRAGMENT_SHADER, spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= true;
		spec.renderOnContexB		= true;
		spec.verifyOnContexA		= true;
		spec.verifyOnContexB		= true;

		shader->addChild(new GLES2ShaderSharingTest(m_eglTestCtx, "render_frag", "Create, render on two contexts and delete", GL_FRAGMENT_SHADER, spec));
	}


	gles2->addChild(shader);


	gles2->addChild(new GLES2SharingThreadedTests(m_eglTestCtx));

	addChild(gles2);
}